

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O1

int __thiscall ircBot::init(ircBot *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  hostent *phVar2;
  size_t sVar3;
  ssize_t sVar4;
  bool bVar5;
  sockaddr_in sa;
  char mybuffer [1000];
  string toserver;
  string join;
  string nick;
  string user;
  stringformatter local_870;
  sockaddr local_868;
  stringformatter local_858 [126];
  char local_468 [272];
  char local_358 [272];
  char local_248 [272];
  char local_138 [264];
  
  iVar1 = getvar((char *)0x15e114);
  if (iVar1 != 0) {
    return iVar1;
  }
  do {
    iVar1 = socket(2,1,6);
    this->sock = iVar1;
    local_868.sa_family = 2;
    phVar2 = gethostbyname(irchost);
    local_868.sa_data._2_4_ = *(undefined4 *)*phVar2->h_addr_list;
    local_868.sa_data._0_2_ = (ushort)ircport << 8 | (ushort)ircport >> 8;
    this->connected = false;
    connect(this->sock,&local_868,0x10);
    local_858[0].buf = local_138;
    stringformatter::operator()(local_858,"USER %s 0 * :%s\r\n",ircbotname);
    iVar1 = this->sock;
    sVar3 = strlen(local_138);
    send(iVar1,local_138,sVar3,0);
    local_858[0].buf = local_248;
    stringformatter::operator()(local_858,"NICK %s\r\n",ircbotname);
    iVar1 = this->sock;
    sVar3 = strlen(local_248);
    send(iVar1,local_248,sVar3,0);
    local_858[0].buf = local_358;
    stringformatter::operator()(local_858,"JOIN %s\r\n",ircchan);
    iVar1 = this->sock;
    sVar3 = strlen(local_358);
    send(iVar1,local_358,sVar3,0);
    puts("[ OK ] Initalizing IRC...");
    while( true ) {
      sVar4 = recv(this->sock,local_858,1000,0);
      ircstring = (int)sVar4;
      bVar5 = this->connected == false;
      if (bVar5) {
        iVar1 = this->sock;
        sVar3 = strlen(local_358);
        send(iVar1,local_358,sVar3,0);
      }
      this->connected = bVar5;
      if (ircstring == 0) break;
      bVar5 = IsCommand(this,(char *)local_858);
      if (!bVar5) {
        local_870.buf = local_468;
        stringformatter::operator()
                  (&local_870,"\f7%s \f3%s \f7- \f0%s\f7: %s",irchost,ircchan,&this->msg,
                   (this->msg).message);
        server::sendservmsg(local_468);
      }
      memset(local_858,0,1000);
    }
    this->connected = false;
  } while( true );
}

Assistant:

void ircBot::init()
{
    if(!getvar("ircignore")) {
    init:
        int con;
        char mybuffer[1000];
        
        struct sockaddr_in sa;
        struct hostent *he;
        
        sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
        
        sa.sin_family = AF_INET;
        he = gethostbyname(irchost);
        bcopy(*he->h_addr_list, (char *)&sa.sin_addr.s_addr, sizeof(sa.sin_addr.s_addr));
        sa.sin_port = htons(ircport);
        connected = false;
        con = connect(sock, (struct sockaddr *)&sa, sizeof(sa));
        
        defformatstring(user)("USER %s 0 * :%s\r\n", ircbotname, ircbotname);
        send(sock, user, strlen(user), 0);
        defformatstring(nick)("NICK %s\r\n", ircbotname);
        send(sock, nick, strlen(nick), 0);
        defformatstring(join)("JOIN %s\r\n", ircchan);
        send(sock, join, strlen(join), 0);
        
        printf("[ OK ] Initalizing IRC...\n");
        
        
        while(1){
            ircstring = recv(sock, mybuffer, sizeof(mybuffer), 0);
            if(!connected)
            {
                send(sock, join, strlen(join), 0);
                connected = true;
            } else {
                connected = false;
            }
            
            if(ircstring) {
                if(!IsCommand(mybuffer)){
                    
                    defformatstring(toserver)("\f7%s \f3%s \f7- \f0%s\f7: %s", irchost, ircchan, msg.nick, msg.message);
                    server::sendservmsg(toserver);
                    
                }
            } else {
                connected = false;
                break;
            }
            
            memset(mybuffer,'\0',1000);
        }
        connected = false;
        if(!connected) goto init; //re-initalize after excess flood
    }
}